

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
::set_ctrl(raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
           *this,size_t i,ctrl_t h)

{
  bool bVar1;
  ctrl_t h_local;
  size_t i_local;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  *this_local;
  
  if (i < this->capacity_) {
    bVar1 = IsFull(h);
    if (bVar1) {
      SanitizerUnpoisonObject<std::pair<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>*>
                (this->slots_ + i);
    }
    else {
      SanitizerPoisonObject<std::pair<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>*>
                (this->slots_ + i);
    }
    this->ctrl_[i] = h;
    this->ctrl_[(i - 0x10 & this->capacity_) + 1 + (this->capacity_ & 0xf)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x8fb,
                "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<Int, Int>, Hash, phmap::EqualTo<Int>, std::allocator<std::pair<const Int, Int>>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::NodeHashMapPolicy<Int, Int>, Hash = Hash, Eq = phmap::EqualTo<Int>, Alloc = std::allocator<std::pair<const Int, Int>>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h) {
        assert(i < capacity_);

        if (IsFull(h)) {
            SanitizerUnpoisonObject(slots_ + i);
        } else {
            SanitizerPoisonObject(slots_ + i);
        }

        ctrl_[i] = h;
        ctrl_[((i - Group::kWidth) & capacity_) + 1 +
              ((Group::kWidth - 1) & capacity_)] = h;
    }